

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_pass(REF_GRID_conflict ref_grid)

{
  int iVar1;
  int node0;
  REF_INT RVar2;
  REF_INT node1;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_CAVITY pRVar5;
  double dVar6;
  REF_GRID_conflict ref_grid_00;
  REF_DBL ref_cavity_00;
  REF_STATUS RVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  int *piVar14;
  REF_NODE pRVar15;
  REF_CELL pRVar16;
  bool bVar17;
  REF_BOOL allowed;
  REF_GRID_conflict local_118;
  REF_NODE local_110;
  REF_CAVITY ref_cavity;
  REF_DBL min_add;
  REF_DBL min_del;
  int local_f0;
  REF_BOOL has_triangle;
  REF_CELL local_e8;
  REF_DBL quality;
  REF_CELL local_d8;
  REF_NODE local_d0;
  REF_INT degree;
  int local_c4;
  REF_BOOL improved;
  REF_BOOL conforming;
  REF_BOOL manifold;
  REF_BOOL same_face;
  double local_b0;
  REF_INT nodes [27];
  
  pRVar15 = ref_grid->node;
  pRVar16 = ref_grid->cell[8];
  iVar12 = 0;
  local_118 = ref_grid;
  local_110 = pRVar15;
  local_e8 = pRVar16;
  while( true ) {
    if (pRVar16->max <= iVar12) break;
    local_d8 = (REF_CELL)CONCAT44(local_d8._4_4_,iVar12);
    RVar7 = ref_cell_nodes(pRVar16,iVar12,nodes);
    if (RVar7 == 0) {
      uVar8 = ref_node_tet_quality(pRVar15,nodes,&quality);
      if (uVar8 != 0) {
        pcVar13 = "qual";
        uVar10 = 0xa50;
        goto LAB_00119c63;
      }
      if (quality < ref_grid->adapt->swap_min_quality) {
        piVar14 = &DAT_00205868;
        local_f0 = -1;
        local_b0 = -2.0;
        for (lVar11 = 0; pRVar16 = local_e8, lVar11 != 0xc; lVar11 = lVar11 + 1) {
          iVar12 = piVar14[-2];
          iVar1 = piVar14[-1];
          node0 = nodes[iVar12];
          lVar9 = (long)node0;
          uVar8 = nodes[iVar1];
          if ((lVar9 < 0) ||
             (((((pRVar3 = ref_grid->cell[9]->ref_adj, pRVar3->nnode <= node0 ||
                 (pRVar3->first[lVar9] == -1)) &&
                ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= node0 ||
                 (pRVar3->first[lVar9] == -1)))) &&
               ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= node0 ||
                (pRVar3->first[lVar9] == -1)))) &&
              ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= node0 ||
               (pRVar3->first[lVar9] == -1)))))) {
            if (-1 < (int)uVar8) {
              pRVar3 = ref_grid->cell[9]->ref_adj;
              if ((((pRVar3->nnode <= (int)uVar8) || (pRVar3->first[uVar8] == -1)) &&
                  ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                   (pRVar3->first[uVar8] == -1)))) &&
                 ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= (int)uVar8 ||
                  (pRVar3->first[uVar8] == -1)))) {
                pRVar3 = ref_grid->cell[6]->ref_adj;
                if (pRVar3->nnode <= (int)uVar8) goto LAB_00118ebe;
                bVar17 = pRVar3->first[uVar8] == -1;
                allowed = (REF_BOOL)bVar17;
                if (bVar17) goto LAB_00118ec6;
                goto LAB_00118e90;
              }
              goto LAB_00118e8b;
            }
LAB_00118ebe:
            allowed = 1;
LAB_00118ec6:
            local_d0 = (REF_NODE)(long)*piVar14;
            uVar8 = ref_cell_local_gem(local_e8,pRVar15,node0,uVar8,&allowed);
            if (uVar8 != 0) {
              pcVar13 = "local gem";
              uVar10 = 0xa5d;
              goto LAB_00119c63;
            }
            if (allowed != 0) {
              RVar2 = nodes[iVar12];
              node1 = nodes[iVar1];
              allowed = 0;
              uVar8 = ref_cell_has_side(ref_grid->cell[3],RVar2,node1,&has_triangle);
              if (uVar8 != 0) {
                pcVar13 = "triangle side";
                uVar10 = 0xa12;
LAB_00119920:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,uVar10,"ref_cavity_edge_swap_boundary",(ulong)uVar8,pcVar13);
                pcVar13 = "surface geom and topo";
                uVar10 = 0xa61;
                goto LAB_00119c63;
              }
              if (has_triangle == 0) {
LAB_00118ff3:
                allowed = 1;
                uVar8 = ref_cell_degree_with2(local_e8,nodes[iVar12],nodes[iVar1],&degree);
                ref_grid = local_118;
                if (uVar8 != 0) {
                  pcVar13 = "edge degree";
                  uVar10 = 0xa64;
                  goto LAB_00119c63;
                }
                pRVar15 = local_110;
                if (degree <= local_118->adapt->swap_max_degree) {
                  uVar8 = ref_cavity_create(&ref_cavity);
                  if (uVar8 != 0) {
                    pcVar13 = "create";
                    uVar10 = 0xa66;
                    goto LAB_00119c63;
                  }
                  pRVar5 = (REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity);
                  RVar7 = ref_cavity_form_edge_swap
                                    (pRVar5,ref_grid,nodes[iVar12],nodes[iVar1],
                                     nodes[(long)local_d0]);
                  if (RVar7 == 0) {
                    if (pRVar5->state == REF_CAVITY_INCONSISTENT) {
                      uVar8 = ref_cavity_free(pRVar5);
                      pRVar15 = local_110;
                      if (uVar8 != 0) {
                        pcVar13 = "free";
                        uVar10 = 0xa70;
                        goto LAB_00119c63;
                      }
                    }
                    else {
                      RVar7 = ref_cavity_check_visible(pRVar5);
                      if (RVar7 == 0) {
                        if (pRVar5->state == REF_CAVITY_VISIBLE) {
                          uVar8 = ref_cavity_ratio(pRVar5,&allowed);
                          if (uVar8 != 0) {
                            pcVar13 = "post ratio limits";
                            uVar10 = 0xa79;
                            goto LAB_00119c63;
                          }
                          if (allowed == 0) {
                            uVar8 = ref_cavity_free(pRVar5);
                            pRVar15 = local_110;
                            if (uVar8 == 0) goto LAB_00118e90;
                            pcVar13 = "free";
                            uVar10 = 0xa7b;
                            goto LAB_00119c63;
                          }
                          uVar8 = ref_cavity_change(pRVar5,&min_del,&min_add);
                          if (uVar8 != 0) {
                            pcVar13 = "change";
                            uVar10 = 0xa7e;
                            goto LAB_00119c63;
                          }
                          dVar6 = (double)CONCAT44(min_add._4_4_,min_add._0_4_);
                          if ((0.0001 < dVar6 - min_del) && (local_b0 < dVar6)) {
                            local_f0 = (int)lVar11;
                            local_b0 = dVar6;
                          }
                        }
                        uVar8 = ref_cavity_free(pRVar5);
                        pRVar15 = local_110;
                        if (uVar8 != 0) {
                          pcVar13 = "free";
                          uVar10 = 0xa86;
                          goto LAB_00119c63;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0xa74,"ref_cavity_swap_tet_pass","check visible");
                        uVar8 = ref_cavity_free(pRVar5);
                        pRVar15 = local_110;
                        if (uVar8 != 0) {
                          pcVar13 = "free";
                          uVar10 = 0xa75;
                          goto LAB_00119c63;
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xa6a,"ref_cavity_swap_tet_pass","form edge swap");
                    uVar8 = ref_cavity_free(pRVar5);
                    pRVar15 = local_110;
                    if (uVar8 != 0) {
                      pcVar13 = "free";
                      uVar10 = 0xa6b;
                      goto LAB_00119c63;
                    }
                  }
                }
              }
              else {
                uVar8 = ref_swap_same_faceid(local_118,RVar2,node1,&same_face);
                if (uVar8 != 0) {
                  pcVar13 = "not allowed if a side of a edge or diff faceid";
                  uVar10 = 0xa19;
                  goto LAB_00119920;
                }
                if (same_face != 0) {
                  uVar8 = ref_swap_manifold(local_118,RVar2,node1,&manifold);
                  if (uVar8 != 0) {
                    pcVar13 = "not allowed if creates a triangle or edge that exists";
                    uVar10 = 0xa20;
                    goto LAB_00119920;
                  }
                  if (manifold != 0) {
                    uVar8 = ref_swap_conforming(local_118,RVar2,node1,&conforming);
                    if (uVar8 != 0) {
                      pcVar13 = "normals and uv area must conform to geom";
                      uVar10 = 0xa27;
                      goto LAB_00119920;
                    }
                    if (conforming != 0) {
                      uVar8 = ref_swap_quality(local_118,RVar2,node1,&improved);
                      if (uVar8 != 0) {
                        pcVar13 = "require tri quality improvement";
                        uVar10 = 0xa2e;
                        goto LAB_00119920;
                      }
                      if (improved != 0) {
                        uVar8 = ref_swap_ratio(local_118,RVar2,node1,&local_c4);
                        if (uVar8 != 0) {
                          pcVar13 = "require tri ratio in limits";
                          uVar10 = 0xa35;
                          goto LAB_00119920;
                        }
                        if (local_c4 != 0) goto LAB_00118ff3;
                      }
                    }
                  }
                }
                allowed = 0;
                pRVar15 = local_110;
                ref_grid = local_118;
              }
            }
          }
          else {
LAB_00118e8b:
            allowed = 0;
          }
LAB_00118e90:
          piVar14 = piVar14 + 3;
        }
        if (local_f0 != -1) {
          uVar8 = ref_cavity_create(&ref_cavity);
          if (uVar8 == 0) {
            lVar11 = (long)local_f0;
            pRVar5 = (REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity);
            uVar8 = ref_cavity_form_edge_swap
                              (pRVar5,ref_grid,nodes[(int)(&DAT_00205860)[lVar11 * 3]],
                               nodes[(int)(&DAT_00205864)[lVar11 * 3]],
                               nodes[(int)(&DAT_00205868)[lVar11 * 3]]);
            if (uVar8 == 0) {
              uVar8 = ref_cavity_check_visible(pRVar5);
              if (uVar8 == 0) {
                if (pRVar5->debug != 0) {
                  uVar8 = ref_cavity_change(pRVar5,&min_del,&min_add);
                  if (uVar8 != 0) {
                    pcVar13 = "change";
                    uVar10 = 0xa92;
                    goto LAB_00119c63;
                  }
                  printf("cavity accepted %f -> %f\n",min_del,CONCAT44(min_add._4_4_,min_add._0_4_))
                  ;
                }
                uVar8 = ref_cavity_replace(pRVar5);
                if (uVar8 == 0) {
                  uVar8 = ref_cavity_free(pRVar5);
                  if (uVar8 == 0) goto LAB_001192cf;
                  pcVar13 = "free";
                  uVar10 = 0xa96;
                }
                else {
                  pcVar13 = "replace";
                  uVar10 = 0xa95;
                }
              }
              else {
                pcVar13 = "enlarge viz";
                uVar10 = 0xa90;
              }
            }
            else {
              pcVar13 = "cavity gem";
              uVar10 = 0xa8f;
            }
          }
          else {
            pcVar13 = "create";
            uVar10 = 0xa89;
          }
LAB_00119c63:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar10,"ref_cavity_swap_tet_pass",(ulong)uVar8,pcVar13);
          pcVar13 = "cavity swap pass";
          uVar10 = 0xb00;
          goto LAB_00119c8b;
        }
      }
    }
LAB_001192cf:
    iVar12 = (int)local_d8 + 1;
  }
  if (ref_grid->surf != 0) {
    local_d0 = ref_grid->node;
    pRVar16 = ref_grid->cell[0];
    local_d8 = ref_grid->cell[3];
    for (iVar12 = 0; iVar12 < pRVar16->max; iVar12 = iVar12 + 1) {
      RVar7 = ref_cell_nodes(pRVar16,iVar12,nodes);
      RVar2 = nodes[1];
      if (RVar7 == 0) {
        local_e8 = (REF_CELL)CONCAT44(local_e8._4_4_,nodes[0]);
        lVar11 = (long)nodes[0];
        if (local_d0->ref_mpi->id == local_d0->part[lVar11]) {
          uVar8 = ref_cell_list_with2(local_d8,nodes[0],nodes[1],2,(REF_INT *)&ref_cavity,
                                      (REF_INT *)&quality);
          if (uVar8 != 0) {
            lVar9 = (long)RVar2;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xac5,"ref_cavity_surf_geom_edge_pass",(ulong)uVar8,"tris");
            ref_grid_00 = local_118;
            pRVar4 = local_118->node->real;
            printf(" %.16e %.16e %.16e\n",pRVar4[lVar11 * 0xf],pRVar4[lVar11 * 0xf + 1],
                   pRVar4[lVar11 * 0xf + 2]);
            pRVar4 = ref_grid_00->node->real;
            printf(" %.16e %.16e %.16e\n",pRVar4[lVar9 * 0xf],pRVar4[lVar9 * 0xf + 1],
                   pRVar4[lVar9 * 0xf + 2]);
            ref_export_tec_surf(ref_grid_00,"ref_cavity_geom_edge_fail.tec");
LAB_00119a8f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xb01,"ref_cavity_pass",(ulong)uVar8,"cavity geom edge");
            return uVar8;
          }
          for (lVar11 = 0; lVar11 < (int)ref_cavity; lVar11 = lVar11 + 1) {
            RVar2 = *(REF_INT *)((long)&quality + lVar11 * 4);
            uVar8 = ref_cell_nodes(local_d8,RVar2,nodes);
            if (uVar8 != 0) {
              pcVar13 = "cell nodes";
              uVar10 = 0xac8;
LAB_00119a83:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,uVar10,"ref_cavity_surf_geom_edge_pass",(ulong)uVar8,pcVar13);
              goto LAB_00119a8f;
            }
            uVar8 = ref_geom_tri_norm_deviation(local_118,nodes,&min_del);
            if (uVar8 != 0) {
              pcVar13 = "nd";
              uVar10 = 0xac9;
              goto LAB_00119a83;
            }
            if (min_del < 0.5) {
              uVar8 = ref_cavity_create((REF_CAVITY *)&min_add);
              if (uVar8 == 0) {
                pRVar5 = (REF_CAVITY)CONCAT44(min_add._4_4_,min_add._0_4_);
                pRVar5->ref_grid = local_118;
                pRVar5->node = (REF_INT)local_e8;
                uVar8 = ref_cavity_add_tri(pRVar5,RVar2);
                if (uVar8 == 0) {
                  uVar8 = ref_cavity_enlarge_conforming(pRVar5);
                  if (uVar8 == 0) {
                    if (pRVar5->state == REF_CAVITY_VISIBLE) {
                      uVar8 = ref_cavity_normdev(pRVar5,&has_triangle);
                      if (uVar8 == 0) {
                        if ((has_triangle == 0) || (uVar8 = ref_cavity_replace(pRVar5), uVar8 == 0))
                        goto LAB_0011945e;
                        pcVar13 = "replace tri";
                        uVar10 = 0xad2;
                      }
                      else {
                        pcVar13 = "normdev tri";
                        uVar10 = 0xad0;
                      }
                    }
                    else {
LAB_0011945e:
                      uVar8 = ref_cavity_free(pRVar5);
                      if (uVar8 == 0) goto LAB_00119471;
                      pcVar13 = "free";
                      uVar10 = 0xad5;
                    }
                  }
                  else {
                    pcVar13 = "enlarge tri";
                    uVar10 = 0xace;
                  }
                }
                else {
                  pcVar13 = "insert tri";
                  uVar10 = 0xacd;
                }
              }
              else {
                pcVar13 = "create";
                uVar10 = 0xacb;
              }
              goto LAB_00119a83;
            }
LAB_00119471:
          }
        }
      }
    }
    if (local_118->surf != 0) {
      pRVar15 = local_118->node;
      pRVar16 = local_118->cell[3];
      for (iVar12 = 0; iVar12 < pRVar16->max; iVar12 = iVar12 + 1) {
        RVar7 = ref_cell_nodes(pRVar16,iVar12,nodes);
        if ((RVar7 == 0) && (pRVar15->ref_mpi->id == pRVar15->part[nodes[0]])) {
          uVar8 = ref_geom_is_a(local_118->geom,nodes[0],1,(REF_BOOL *)&ref_cavity);
          if (uVar8 != 0) {
            pcVar13 = "n";
            uVar10 = 0xaea;
            goto LAB_00119ced;
          }
          if ((int)ref_cavity == 0) {
            uVar8 = ref_geom_tri_norm_deviation(local_118,nodes,&quality);
            if (uVar8 != 0) {
              pcVar13 = "nd";
              uVar10 = 0xaee;
              goto LAB_00119ced;
            }
            if (quality < 0.1) {
              uVar8 = ref_cavity_create((REF_CAVITY *)&min_del);
              ref_cavity_00 = min_del;
              if (uVar8 != 0) {
                pcVar13 = "create";
                uVar10 = 0xaf0;
LAB_00119ced:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,uVar10,"ref_cavity_surf_geom_face_pass",(ulong)uVar8,pcVar13);
                pcVar13 = "cavity geom edge";
                uVar10 = 0xb02;
LAB_00119c8b:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,uVar10,"ref_cavity_pass",(ulong)uVar8,pcVar13);
                return uVar8;
              }
              uVar8 = ref_cavity_form_ball((REF_CAVITY)min_del,local_118,nodes[0]);
              if (uVar8 != 0) {
                pcVar13 = "insert ball";
                uVar10 = 0xaf1;
                goto LAB_00119ced;
              }
              uVar8 = ref_cavity_enlarge_conforming((REF_CAVITY)ref_cavity_00);
              if (uVar8 != 0) {
                pcVar13 = "enlarge tri";
                uVar10 = 0xaf2;
                goto LAB_00119ced;
              }
              if (*(int *)ref_cavity_00 == 1) {
                uVar8 = ref_cavity_normdev((REF_CAVITY)ref_cavity_00,(REF_BOOL *)&min_add);
                if (uVar8 != 0) {
                  pcVar13 = "normdev tri";
                  uVar10 = 0xaf4;
                  goto LAB_00119ced;
                }
                if ((min_add._0_4_ != 0) &&
                   (uVar8 = ref_cavity_replace((REF_CAVITY)ref_cavity_00), uVar8 != 0)) {
                  pcVar13 = "replace tri";
                  uVar10 = 0xaf6;
                  goto LAB_00119ced;
                }
              }
              uVar8 = ref_cavity_free((REF_CAVITY)ref_cavity_00);
              if (uVar8 != 0) {
                pcVar13 = "free";
                uVar10 = 0xaf9;
                goto LAB_00119ced;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_pass(REF_GRID ref_grid) {
  RSS(ref_cavity_swap_tet_pass(ref_grid), "cavity swap pass");
  RSS(ref_cavity_surf_geom_edge_pass(ref_grid), "cavity geom edge");
  RSS(ref_cavity_surf_geom_face_pass(ref_grid), "cavity geom edge");
  return REF_SUCCESS;
}